

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subscription_queue.cpp
# Opt level: O1

void __thiscall
miniros::SubscriptionQueue::SubscriptionQueue
          (SubscriptionQueue *this,string *topic,int32_t queue_size,bool allow_concurrent_callbacks)

{
  pointer pcVar1;
  
  (this->super_enable_shared_from_this<miniros::SubscriptionQueue>)._M_weak_this.
  super___weak_ptr<miniros::SubscriptionQueue,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->super_enable_shared_from_this<miniros::SubscriptionQueue>)._M_weak_this.
  super___weak_ptr<miniros::SubscriptionQueue,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->super_CallbackInterface)._vptr_CallbackInterface =
       (_func_int **)&PTR__SubscriptionQueue_002acef0;
  (this->topic_)._M_dataplus._M_p = (pointer)&(this->topic_).field_2;
  pcVar1 = (topic->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->topic_,pcVar1,pcVar1 + topic->_M_string_length);
  this->size_ = queue_size;
  this->full_ = false;
  (this->queue_mutex_).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->queue_mutex_).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->queue_mutex_).super___mutex_base._M_mutex + 0x10) = 0;
  (this->queue_mutex_).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->queue_mutex_).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  (this->queue_).
  super__Deque_base<miniros::SubscriptionQueue::Item,_std::allocator<miniros::SubscriptionQueue::Item>_>
  ._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  (this->queue_).
  super__Deque_base<miniros::SubscriptionQueue::Item,_std::allocator<miniros::SubscriptionQueue::Item>_>
  ._M_impl.super__Deque_impl_data._M_map_size = 0;
  (this->queue_).
  super__Deque_base<miniros::SubscriptionQueue::Item,_std::allocator<miniros::SubscriptionQueue::Item>_>
  ._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  (this->queue_).
  super__Deque_base<miniros::SubscriptionQueue::Item,_std::allocator<miniros::SubscriptionQueue::Item>_>
  ._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  (this->queue_).
  super__Deque_base<miniros::SubscriptionQueue::Item,_std::allocator<miniros::SubscriptionQueue::Item>_>
  ._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  (this->queue_).
  super__Deque_base<miniros::SubscriptionQueue::Item,_std::allocator<miniros::SubscriptionQueue::Item>_>
  ._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  (this->queue_).
  super__Deque_base<miniros::SubscriptionQueue::Item,_std::allocator<miniros::SubscriptionQueue::Item>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  (this->queue_).
  super__Deque_base<miniros::SubscriptionQueue::Item,_std::allocator<miniros::SubscriptionQueue::Item>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  (this->queue_).
  super__Deque_base<miniros::SubscriptionQueue::Item,_std::allocator<miniros::SubscriptionQueue::Item>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  (this->queue_).
  super__Deque_base<miniros::SubscriptionQueue::Item,_std::allocator<miniros::SubscriptionQueue::Item>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  std::
  _Deque_base<miniros::SubscriptionQueue::Item,_std::allocator<miniros::SubscriptionQueue::Item>_>::
  _M_initialize_map(&(this->queue_).
                     super__Deque_base<miniros::SubscriptionQueue::Item,_std::allocator<miniros::SubscriptionQueue::Item>_>
                    ,0);
  this->queue_size_ = 0;
  this->allow_concurrent_callbacks_ = allow_concurrent_callbacks;
  *(undefined8 *)((long)&(this->callback_mutex_).super___recursive_mutex_base._M_mutex + 0x10) = 0;
  (this->callback_mutex_).super___recursive_mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->callback_mutex_).super___recursive_mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->callback_mutex_).super___recursive_mutex_base._M_mutex + 8) = 0;
  (this->callback_mutex_).super___recursive_mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  (this->callback_mutex_).super___recursive_mutex_base._M_mutex.__data.__kind = 1;
  return;
}

Assistant:

SubscriptionQueue::SubscriptionQueue(const std::string& topic, int32_t queue_size, bool allow_concurrent_callbacks)
: topic_(topic)
, size_(queue_size)
, full_(false)
, queue_size_(0)
, allow_concurrent_callbacks_(allow_concurrent_callbacks)
{}